

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Zp_field.h
# Opt level: O2

Element_conflict
Gudhi::persistence_fields::Zp_field_element<13u,unsigned_int,void>::_get_value<int,void>(int e)

{
  Element_conflict EVar1;
  uint uVar2;
  uint uVar3;
  
  uVar3 = e;
  if (e < -0xd) {
    uVar3 = (uint)e % 0xd;
  }
  uVar2 = (uint)e % 0xd;
  if (uVar3 < 0xd) {
    uVar2 = uVar3;
  }
  EVar1 = uVar3 + 0xd;
  if (-1 < (int)uVar3) {
    EVar1 = uVar2;
  }
  return EVar1;
}

Assistant:

static constexpr Element _get_value(Integer_type e) {
    if constexpr (std::is_signed_v<Integer_type>) {
      if (e < -static_cast<Integer_type>(characteristic)) e = e % characteristic;
      if (e < 0) return e += characteristic;
      return e < static_cast<Integer_type>(characteristic) ? e : e % characteristic;
    } else {
      return e < characteristic ? e : e % characteristic;
    }
  }